

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump.cpp
# Opt level: O1

void Utils::hexDump(FastString *out,uint8 *array,uint32 length,uint32 colSize,bool withAddress,
                   bool withCharVal)

{
  byte bVar1;
  int iVar2;
  uint32 k;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  String local_48;
  ulong local_38;
  
  if (length == 0) {
    uVar6 = 0;
  }
  else {
    uVar5 = -colSize;
    local_38 = (ulong)colSize;
    uVar6 = 0;
    do {
      uVar4 = (ulong)uVar5;
      if ((int)((uVar6 & 0xffffffff) % (ulong)colSize) == 0) {
        if ((uVar6 != 0 && withCharVal) && (Bstrlib::String::operator+=(out," "), local_38 <= uVar6)
           ) {
          do {
            bVar1 = array[uVar4];
            if ((char)bVar1 < ' ') {
              bVar1 = 0x2e;
            }
            Bstrlib::String::Print((char *)&local_48,"%c",(ulong)bVar1);
            Bstrlib::String::operator+=(out,&local_48);
            Bstrlib::String::~String(&local_48);
            uVar4 = uVar4 + 1;
          } while (uVar4 < uVar6);
        }
        Bstrlib::String::operator+=(out,"\n");
        if (withAddress) {
          Bstrlib::String::Print((char *)&local_48,"%08X ",uVar6 & 0xffffffff);
          Bstrlib::String::operator+=(out,&local_48);
          Bstrlib::String::~String(&local_48);
        }
      }
      Bstrlib::String::Print((char *)&local_48,"%02X ",(ulong)array[uVar6]);
      Bstrlib::String::operator+=(out,&local_48);
      Bstrlib::String::~String(&local_48);
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar6 != length);
  }
  uVar5 = (uint)uVar6;
  if (withCharVal && uVar5 != 0) {
    uVar3 = 0;
    iVar2 = (int)((uVar6 & 0xffffffff) % (ulong)colSize);
    do {
      Bstrlib::String::operator+=(out,"   ");
      uVar3 = uVar3 + 1;
    } while (uVar3 < colSize - iVar2);
    Bstrlib::String::operator+=(out," ");
    if (uVar5 - iVar2 < uVar5) {
      uVar4 = ((uVar6 & 0xffffffff) / (ulong)colSize) * (ulong)colSize;
      do {
        bVar1 = array[uVar4];
        if ((char)bVar1 < ' ') {
          bVar1 = 0x2e;
        }
        Bstrlib::String::Print((char *)&local_48,"%c",(ulong)bVar1);
        Bstrlib::String::operator+=(out,&local_48);
        Bstrlib::String::~String(&local_48);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (uVar6 & 0xffffffff));
    }
  }
  return;
}

Assistant:

void hexDump(Strings::FastString & out, const uint8 * const array, const uint32 length, const uint32 colSize, const bool withAddress, const bool withCharVal)
    {
        uint32 i = 0;
        for (; i < length; i++)
        {
            if ((i % colSize) == 0)
            {
                // Output the charVal if any present
                if (withCharVal && i)
                {
                    out += " ";
                    for (uint32 j = i - colSize; j < i; j++)
                    {
                        out += Strings::FastString::Print("%c", (array[j] < 32 || array[j] >= 0x80) ? '.' : array[j]);
                    }
                }

                out += "\n";
                if (withAddress)
                    out += Strings::FastString::Print("%08X ", i);

            }
            out += Strings::FastString::Print("%02X ", (unsigned int)array[i]);
        }
        // Output the charVal if any present
        if (withCharVal && i)
        {
            for (uint32 k = 0; k < colSize - (i % colSize); k++)
                out += "   ";

            out += " ";
            for (uint32 j = i - (i % colSize); j < i; j++)
            {
                out += Strings::FastString::Print("%c", (array[j] < 32 || array[j] >= 0x80) ? '.' : array[j]);
            }
        }
    }